

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.h
# Opt level: O0

void __thiscall asl::String::alloc(String *this,int n)

{
  int iVar1;
  char *pcVar2;
  bad_alloc *this_00;
  int n_local;
  String *this_local;
  
  if (n < 0x10) {
    this->_size = 0;
  }
  else {
    iVar1 = max<int>(n + 1,0x14);
    this->_size = iVar1;
    pcVar2 = (char *)malloc((long)this->_size);
    (this->field_2)._str = pcVar2;
    if ((this->field_2)._str == (char *)0x0) {
      this_00 = (bad_alloc *)__cxa_allocate_exception(8);
      std::bad_alloc::bad_alloc(this_00);
      __cxa_throw(this_00,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  return;
}

Assistant:

void alloc(int n)
	{
		if (n < ASL_STR_SPACE)
			_size = 0;
		else
		{
			_size = max(++n, 20);
			_str = (char*)malloc(_size);
			if (!_str)
				ASL_BAD_ALLOC();
		}
	}